

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O0

int32_t __thiscall gnilk::IPCFifoUnix::Write(IPCFifoUnix *this,void *data,size_t szBytes)

{
  ssize_t sVar1;
  int32_t res;
  size_t szBytes_local;
  void *data_local;
  IPCFifoUnix *this_local;
  
  if ((this->isOpen & 1U) == 0) {
    this_local._4_4_ = -1;
  }
  else {
    sVar1 = write(this->rwfd,data,szBytes);
    this_local._4_4_ = (int)sVar1;
    if (this_local._4_4_ < 0) {
      perror("IPCFifoUnix::Write");
    }
    fsync(this->rwfd);
  }
  return this_local._4_4_;
}

Assistant:

int32_t IPCFifoUnix::Write(const void *data, size_t szBytes) {
    if (!isOpen) {
        // Auto open here???
        return -1;
    }

    auto res =  (int32_t)write(rwfd, data, szBytes);
    if (res < 0) {
        perror("IPCFifoUnix::Write");
    }
    fsync(rwfd);
    return res;
}